

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_ptr<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,unsigned_long value,
          basic_format_specs<wchar_t> *specs)

{
  int value_00;
  type tVar1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar2;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_30;
  
  value_00 = count_digits<4,unsigned_long>(value);
  tVar1 = to_unsigned<int>(value_00);
  local_30.value = value;
  local_30.num_digits = value_00;
  if (specs == (basic_format_specs<wchar_t> *)0x0) {
    bVar2 = write_ptr<wchar_t,_std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_unsigned_long>
            ::anon_class_16_2_92d121e5::operator()(&local_30,out.container);
  }
  else {
    bVar2 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_ptr<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long,fmt::v8::basic_format_specs<wchar_t>const*)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_&>
                      (out,specs,(ulong)tVar1 + 2,&local_30);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar2.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}